

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.hpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::CompilerHLSL(CompilerHLSL *this,ParsedIR *ir_)

{
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerHLSL_003602a0;
  (this->hlsl_options).shader_model = 0x1e;
  (this->hlsl_options).point_size_compat = false;
  (this->hlsl_options).point_coord_compat = false;
  (this->hlsl_options).support_nonzero_base_vertex_base_instance = false;
  (this->hlsl_options).force_storage_buffer_as_uav = false;
  (this->hlsl_options).nonwritable_uav_texture_as_srv = false;
  (this->hlsl_options).enable_16bit_types = false;
  (this->hlsl_options).flatten_matrix_vertex_input_semantics = false;
  (this->hlsl_options).use_entry_point_name = false;
  (this->hlsl_options).preserve_structured_buffers = false;
  this->requires_op_fmod = false;
  this->requires_fp16_packing = false;
  this->requires_uint2_packing = false;
  this->requires_explicit_fp16_packing = false;
  this->requires_unorm8_packing = false;
  this->requires_snorm8_packing = false;
  this->requires_unorm16_packing = false;
  this->requires_snorm16_packing = false;
  this->requires_bitfield_insert = false;
  this->requires_bitfield_extract = false;
  this->requires_inverse_2x2 = false;
  this->requires_inverse_3x3 = false;
  this->requires_inverse_4x4 = false;
  this->requires_scalar_reflect = false;
  this->requires_scalar_refract = false;
  this->requires_scalar_faceforward = false;
  (this->required_texture_size_variants).srv = 0;
  (this->required_texture_size_variants).uav[0][0] = 0;
  (this->required_texture_size_variants).uav[0][1] = 0;
  (this->required_texture_size_variants).uav[0][2] = 0;
  (this->required_texture_size_variants).uav[0][3] = 0;
  (this->required_texture_size_variants).uav[1][0] = 0;
  (this->required_texture_size_variants).uav[1][1] = 0;
  (this->required_texture_size_variants).uav[1][2] = 0;
  (this->required_texture_size_variants).uav[1][3] = 0;
  (this->required_texture_size_variants).uav[2][0] = 0;
  (this->required_texture_size_variants).uav[2][1] = 0;
  (this->required_texture_size_variants).uav[2][2] = 0;
  (this->required_texture_size_variants).uav[2][3] = 0;
  this->require_output = false;
  this->require_input = false;
  (this->remap_vertex_attributes).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr =
       (HLSLVertexAttributeRemap *)0x0;
  (this->remap_vertex_attributes).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.
  buffer_size = 0;
  (this->remap_vertex_attributes).super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr =
       (HLSLVertexAttributeRemap *)&(this->remap_vertex_attributes).stack_storage;
  (this->remap_vertex_attributes).buffer_capacity = 8;
  this->num_workgroups_builtin = 0;
  this->resource_binding_flags = 0;
  (this->root_constants_layout).
  super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root_constants_layout).
  super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root_constants_layout).
  super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->unique_identifier_count = 0;
  (this->resource_bindings)._M_h._M_buckets = &(this->resource_bindings)._M_h._M_single_bucket;
  (this->resource_bindings)._M_h._M_bucket_count = 1;
  (this->resource_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_bindings)._M_h._M_element_count = 0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->force_uav_buffer_bindings)._M_h._M_buckets =
       &(this->force_uav_buffer_bindings)._M_h._M_single_bucket;
  (this->force_uav_buffer_bindings)._M_h._M_bucket_count = 1;
  (this->force_uav_buffer_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->force_uav_buffer_bindings)._M_h._M_element_count = 0;
  (this->force_uav_buffer_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->composite_selection_workaround_types).
  super__Vector_base<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->composite_selection_workaround_types).
  super__Vector_base<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->composite_selection_workaround_types).
  super__Vector_base<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this->force_uav_buffer_bindings)._M_h._M_single_bucket + 2) = 0;
  *(undefined8 *)((long)&(this->base_vertex_info).register_index + 2) = 0;
  (this->force_uav_buffer_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->force_uav_buffer_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit CompilerHLSL(ParsedIR &&ir_)
	    : CompilerGLSL(std::move(ir_))
	{
	}